

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::NameResolver::VisitModule(NameResolver *this,Module *module)

{
  ExprVisitor *this_00;
  pointer ppFVar1;
  Func *func;
  pointer ppEVar2;
  Export *pEVar3;
  pointer ppGVar4;
  pointer ppTVar5;
  pointer ppEVar6;
  ElemSegment *pEVar7;
  pointer piVar8;
  pointer ppDVar9;
  DataSegment *pDVar10;
  pointer ppVVar11;
  reference pvVar12;
  VarExpr<(wabt::ExprType)36> *pVVar13;
  ExprList *elem_expr;
  pointer ppEVar14;
  pointer this_01;
  pointer ppEVar15;
  pointer ppFVar16;
  pointer ppGVar17;
  pointer ppTVar18;
  pointer ppDVar19;
  pointer ppVVar20;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this->current_module_ = module;
  CheckDuplicateBindings(this,&module->elem_segment_bindings,"elem");
  CheckDuplicateBindings(this,&module->func_bindings,"function");
  CheckDuplicateBindings(this,&module->global_bindings,"global");
  CheckDuplicateBindings(this,&module->type_bindings,"type");
  CheckDuplicateBindings(this,&module->table_bindings,"table");
  CheckDuplicateBindings(this,&module->memory_bindings,"memory");
  CheckDuplicateBindings(this,&module->tag_bindings,"tag");
  ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_00 = &this->visitor_;
  for (ppFVar16 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppFVar16 != ppFVar1;
      ppFVar16 = ppFVar16 + 1) {
    func = *ppFVar16;
    this->current_func_ = func;
    if ((func->decl).has_func_type == true) {
      ResolveFuncTypeVar(this,&(func->decl).type_var);
    }
    local_38 = std::
               _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/resolve-names.cc:492:7)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/resolve-names.cc:492:7)>
               ::_M_manager;
    local_50._M_unused._0_8_ = (undefined8)func;
    local_50._8_8_ = this;
    BindingHash::FindDuplicates(&func->bindings,(DuplicateCallback *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    ExprVisitor::VisitFunc(this_00,func);
    this->current_func_ = (Func *)0x0;
  }
  ppEVar2 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar14 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar14 != ppEVar2; ppEVar14 = ppEVar14 + 1) {
    pEVar3 = *ppEVar14;
    switch(pEVar3->kind) {
    case First:
      ResolveFuncVar(this,&pEVar3->var);
      break;
    case Table:
      ResolveTableVar(this,&pEVar3->var);
      break;
    case Memory:
      ResolveMemoryVar(this,&pEVar3->var);
      break;
    case Global:
      ResolveGlobalVar(this,&pEVar3->var);
      break;
    case Last:
      ResolveTagVar(this,&pEVar3->var);
    }
  }
  ppGVar4 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppGVar17 = (module->globals).
                  super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppGVar17 != ppGVar4; ppGVar17 = ppGVar17 + 1) {
    ExprVisitor::VisitExprList(this_00,&(*ppGVar17)->init_expr);
  }
  ppTVar5 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar18 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppTVar18 != ppTVar5;
      ppTVar18 = ppTVar18 + 1) {
    if (((*ppTVar18)->decl).has_func_type == true) {
      ResolveFuncTypeVar(this,&((*ppTVar18)->decl).type_var);
    }
  }
  ppEVar6 = (module->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar15 = (module->elem_segments).
                  super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppEVar15 != ppEVar6;
      ppEVar15 = ppEVar15 + 1) {
    pEVar7 = *ppEVar15;
    ResolveTableVar(this,&pEVar7->table_var);
    ExprVisitor::VisitExprList(this_00,&pEVar7->offset);
    piVar8 = (pEVar7->elem_exprs).
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (pEVar7->elem_exprs).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != piVar8;
        this_01 = this_01 + 1) {
      if ((this_01->size_ == 1) &&
         (pvVar12 = intrusive_list<wabt::Expr>::front(this_01), pvVar12->type_ == RefFunc)) {
        pvVar12 = intrusive_list<wabt::Expr>::front(this_01);
        pVVar13 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(pvVar12);
        ResolveFuncVar(this,&pVVar13->var);
      }
    }
  }
  ppDVar9 = (module->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar19 = (module->data_segments).
                  super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppDVar19 != ppDVar9;
      ppDVar19 = ppDVar19 + 1) {
    pDVar10 = *ppDVar19;
    ResolveMemoryVar(this,&pDVar10->memory_var);
    ExprVisitor::VisitExprList(this_00,&pDVar10->offset);
  }
  ppVVar11 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppVVar20 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVVar20 != ppVVar11;
      ppVVar20 = ppVVar20 + 1) {
    ResolveFuncVar(this,*ppVVar20);
  }
  this->current_module_ = (Module *)0x0;
  return (Result)(this->result_).enum_;
}

Assistant:

Result NameResolver::VisitModule(Module* module) {
  current_module_ = module;
  CheckDuplicateBindings(&module->elem_segment_bindings, "elem");
  CheckDuplicateBindings(&module->func_bindings, "function");
  CheckDuplicateBindings(&module->global_bindings, "global");
  CheckDuplicateBindings(&module->type_bindings, "type");
  CheckDuplicateBindings(&module->table_bindings, "table");
  CheckDuplicateBindings(&module->memory_bindings, "memory");
  CheckDuplicateBindings(&module->tag_bindings, "tag");

  for (Func* func : module->funcs)
    VisitFunc(func);
  for (Export* export_ : module->exports)
    VisitExport(export_);
  for (Global* global : module->globals)
    VisitGlobal(global);
  for (Tag* tag : module->tags)
    VisitTag(tag);
  for (ElemSegment* elem_segment : module->elem_segments)
    VisitElemSegment(elem_segment);
  for (DataSegment* data_segment : module->data_segments)
    VisitDataSegment(data_segment);
  for (Var* start : module->starts)
    ResolveFuncVar(start);
  current_module_ = nullptr;
  return result_;
}